

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCodeEditor_UNIX.cxx
# Opt level: O0

pid_t __thiscall ExternalCodeEditor::reap_editor(ExternalCodeEditor *this)

{
  int iVar1;
  __pid_t _Var2;
  int local_1c;
  pid_t wpid;
  int status;
  ExternalCodeEditor *this_local;
  
  _wpid = this;
  iVar1 = is_editing(this);
  if (iVar1 == 0) {
    this_local._4_4_ = -2;
  }
  else {
    local_1c = 0;
    _Var2 = waitpid(this->pid_,&local_1c,1);
    if (_Var2 == -1) {
      this_local._4_4_ = -1;
    }
    else if (_Var2 == 0) {
      this_local._4_4_ = 0;
    }
    else {
      remove_tmpfile(this);
      this->pid_ = -1;
      L_editors_open = L_editors_open + -1;
      if (L_editors_open < 1) {
        stop_update_timer();
      }
      this_local._4_4_ = _Var2;
      if (G_debug != 0) {
        printf("*** EDITOR REAPED: pid=%ld #open=%d\n",(long)_Var2,(ulong)(uint)L_editors_open);
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

pid_t ExternalCodeEditor::reap_editor() {
  if ( !is_editing() ) return -2;
  int status = 0;
  pid_t wpid;
  switch (wpid = waitpid(pid_, &status, WNOHANG)) {
    case -1:    // waitpid() failed
      return -1;
    case 0:     // process didn't reap, still running
      return 0;
    default:    // process reaped
      remove_tmpfile(); // also zeroes mtime/size
      pid_ = -1;
      if ( --L_editors_open <= 0 )
        { stop_update_timer(); }
      break;
  }
  if ( G_debug ) 
    printf("*** EDITOR REAPED: pid=%ld #open=%d\n", long(wpid), L_editors_open);
  return wpid;
}